

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O1

void __thiscall
FVoxelModel::RenderFrame
          (FVoxelModel *this,FTexture *skin,int frame,int frame2,double inter,int translation)

{
  FMaterial *this_00;
  
  this_00 = FMaterial::ValidateTexture(skin,false);
  gl_RenderState.mEffectState = this_00->mShaderIndex;
  gl_RenderState.mShaderTimer = (this_00->tex->gl_info).shaderspeed;
  FMaterial::Bind(this_00,5,translation);
  FRenderState::Apply(&gl_RenderState);
  FModelVertexBuffer::SetupFrame((this->super_FModel).mVBuf,0,0,0);
  (*_ptrc_glDrawElements)(4,this->mNumIndices,0x1405,(void *)0x0);
  return;
}

Assistant:

void FVoxelModel::RenderFrame(FTexture * skin, int frame, int frame2, double inter, int translation)
{
	FMaterial * tex = FMaterial::ValidateTexture(skin, false);
	gl_RenderState.SetMaterial(tex, CLAMP_NOFILTER, translation, -1, false);

	gl_RenderState.Apply();
	mVBuf->SetupFrame(0, 0, 0);
	glDrawElements(GL_TRIANGLES, mNumIndices, GL_UNSIGNED_INT, (void*)(intptr_t)0);
}